

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

void __thiscall ON__LayerExtensions::ON__LayerExtensions(ON__LayerExtensions *this)

{
  ON_UUID OVar1;
  
  ON_UserData::ON_UserData(&this->super_ON_UserData);
  (this->super_ON_UserData).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00824520;
  (this->m_vp_settings)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00824650;
  (this->m_vp_settings).m_a = (ON__LayerPerViewSettings *)0x0;
  (this->m_vp_settings).m_count = 0;
  (this->m_vp_settings).m_capacity = 0;
  OVar1 = ON_ClassId::Uuid(&m_ON__LayerExtensions_class_rtti);
  (this->super_ON_UserData).m_userdata_uuid = OVar1;
  (this->super_ON_UserData).m_application_uuid.Data1 = 0xc8cda597;
  (this->super_ON_UserData).m_application_uuid.Data2 = 0xd957;
  (this->super_ON_UserData).m_application_uuid.Data3 = 0x4625;
  (this->super_ON_UserData).m_application_uuid.Data4[0] = 0xa4;
  (this->super_ON_UserData).m_application_uuid.Data4[1] = 0xb3;
  (this->super_ON_UserData).m_application_uuid.Data4[2] = 0xa0;
  (this->super_ON_UserData).m_application_uuid.Data4[3] = 0xb5;
  (this->super_ON_UserData).m_application_uuid.Data4[4] = '\x10';
  (this->super_ON_UserData).m_application_uuid.Data4[5] = 0xfc;
  (this->super_ON_UserData).m_application_uuid.Data4[6] = '0';
  (this->super_ON_UserData).m_application_uuid.Data4[7] = 0xd4;
  (this->super_ON_UserData).m_userdata_copycount = 1;
  return;
}

Assistant:

ON__LayerExtensions::ON__LayerExtensions()
{
  m_userdata_uuid = ON_CLASS_ID(ON__LayerExtensions);
  m_application_uuid = ON_opennurbs5_id;
  m_userdata_copycount = 1;
}